

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void define_gf_group_pass0(AV1_COMP *cpi)

{
  FRAME_UPDATE_TYPE FVar1;
  AV1_PRIMARY *pAVar2;
  AV1_PRIMARY *pAVar3;
  int iVar4;
  AV1_COMP *in_RDI;
  AV1_COMP *unaff_retaddr;
  FRAME_UPDATE_TYPE cur_update_type;
  int cur_index;
  int target;
  GFConfig *gf_cfg;
  AV1EncoderConfig *oxcf;
  GF_GROUP *gf_group;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  FRAME_UPDATE_TYPE in_stack_ffffffffffffffbf;
  uint7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  int local_38;
  int in_stack_ffffffffffffffcc;
  AV1_COMP *cpi_00;
  AV1_COMP *cpi_01;
  
  cpi_01 = (AV1_COMP *)&in_RDI->rc;
  pAVar2 = in_RDI->ppi;
  pAVar3 = in_RDI->ppi;
  cpi_00 = (AV1_COMP *)&(in_RDI->oxcf).gf_cfg;
  if ((in_RDI->oxcf).q_cfg.aq_mode == '\x03') {
    av1_cyclic_refresh_set_golden_update(in_RDI);
  }
  else {
    (pAVar2->p_rc).baseline_gf_interval = (pAVar2->p_rc).gf_intervals[(pAVar2->p_rc).cur_gf_index];
    (in_RDI->rc).intervals_till_gf_calculate_due = (in_RDI->rc).intervals_till_gf_calculate_due + -1
    ;
    (pAVar2->p_rc).cur_gf_index = (pAVar2->p_rc).cur_gf_index + 1;
  }
  correct_frames_to_key((AV1_COMP *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  if (*(int *)((long)(cpi_01->enc_quant_dequant_params).quants.y_quant[1] + 0xc) <
      (pAVar2->p_rc).baseline_gf_interval) {
    (pAVar2->p_rc).baseline_gf_interval =
         *(int *)((long)(cpi_01->enc_quant_dequant_params).quants.y_quant[1] + 0xc);
  }
  (pAVar2->p_rc).gfu_boost = 2000;
  (pAVar2->p_rc).constrained_gf_group =
       (uint)(*(int *)((long)(cpi_01->enc_quant_dequant_params).quants.y_quant[1] + 0xc) <=
             (pAVar2->p_rc).baseline_gf_interval);
  (pAVar3->gf_group).max_layer_depth_allowed = (in_RDI->oxcf).gf_cfg.gf_max_pyr_height;
  if (((*(int *)&cpi_00->ppi < (pAVar2->p_rc).baseline_gf_interval) ||
      (iVar4 = is_altref_enabled(*(int *)&cpi_00->ppi,
                                 (_Bool)(*(_Bool *)((long)(cpi_00->enc_quant_dequant_params).quants.
                                                          y_quant[0] + 4) & 1)), iVar4 == 0)) ||
     ((pAVar2->p_rc).baseline_gf_interval <
      *(int *)(cpi_01->enc_quant_dequant_params).quants.y_quant[1])) {
    (pAVar3->gf_group).max_layer_depth_allowed = 0;
  }
  av1_gop_setup_structure(cpi_01);
  for (local_38 = 0; local_38 < (pAVar3->gf_group).size; local_38 = local_38 + 1) {
    FVar1 = (pAVar3->gf_group).update_type[local_38];
    if ((in_RDI->oxcf).rc_cfg.mode == AOM_CBR) {
      if (FVar1 == '\0') {
        in_stack_ffffffffffffffcc = av1_calc_iframe_target_size_one_pass_cbr(unaff_retaddr);
      }
      else {
        in_stack_ffffffffffffffcc =
             av1_calc_pframe_target_size_one_pass_cbr
                       ((AV1_COMP *)CONCAT17(FVar1,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbf);
      }
    }
    else if (FVar1 == '\0') {
      in_stack_ffffffffffffffcc =
           av1_calc_iframe_target_size_one_pass_vbr((AV1_COMP *)(ulong)in_stack_ffffffffffffffc0);
    }
    else {
      in_stack_ffffffffffffffcc =
           av1_calc_pframe_target_size_one_pass_vbr
                     (cpi_00,(FRAME_UPDATE_TYPE)((uint)in_stack_ffffffffffffffcc >> 0x18));
    }
    (pAVar3->gf_group).bit_allocation[local_38] = in_stack_ffffffffffffffcc;
  }
  return;
}

Assistant:

static void define_gf_group_pass0(AV1_COMP *cpi) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  const GFConfig *const gf_cfg = &oxcf->gf_cfg;
  int target;

  if (oxcf->q_cfg.aq_mode == CYCLIC_REFRESH_AQ) {
    av1_cyclic_refresh_set_golden_update(cpi);
  } else {
    p_rc->baseline_gf_interval = p_rc->gf_intervals[p_rc->cur_gf_index];
    rc->intervals_till_gf_calculate_due--;
    p_rc->cur_gf_index++;
  }

  // correct frames_to_key when lookahead queue is flushing
  correct_frames_to_key(cpi);

  if (p_rc->baseline_gf_interval > rc->frames_to_key)
    p_rc->baseline_gf_interval = rc->frames_to_key;

  p_rc->gfu_boost = DEFAULT_GF_BOOST;
  p_rc->constrained_gf_group =
      (p_rc->baseline_gf_interval >= rc->frames_to_key) ? 1 : 0;

  gf_group->max_layer_depth_allowed = oxcf->gf_cfg.gf_max_pyr_height;

  // Rare case when the look-ahead is less than the target GOP length, can't
  // generate ARF frame.
  if (p_rc->baseline_gf_interval > gf_cfg->lag_in_frames ||
      !is_altref_enabled(gf_cfg->lag_in_frames, gf_cfg->enable_auto_arf) ||
      p_rc->baseline_gf_interval < rc->min_gf_interval)
    gf_group->max_layer_depth_allowed = 0;

  // Set up the structure of this Group-Of-Pictures (same as GF_GROUP)
  av1_gop_setup_structure(cpi);

  // Allocate bits to each of the frames in the GF group.
  // TODO(sarahparker) Extend this to work with pyramid structure.
  for (int cur_index = 0; cur_index < gf_group->size; ++cur_index) {
    const FRAME_UPDATE_TYPE cur_update_type = gf_group->update_type[cur_index];
    if (oxcf->rc_cfg.mode == AOM_CBR) {
      if (cur_update_type == KF_UPDATE) {
        target = av1_calc_iframe_target_size_one_pass_cbr(cpi);
      } else {
        target = av1_calc_pframe_target_size_one_pass_cbr(cpi, cur_update_type);
      }
    } else {
      if (cur_update_type == KF_UPDATE) {
        target = av1_calc_iframe_target_size_one_pass_vbr(cpi);
      } else {
        target = av1_calc_pframe_target_size_one_pass_vbr(cpi, cur_update_type);
      }
    }
    gf_group->bit_allocation[cur_index] = target;
  }
}